

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O3

long FMget_array_element_count(FMFormat_conflict f,FMVarInfoList var,char *data,int encode)

{
  size_t sVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  _FMgetFieldStruct local_48;
  
  iVar2 = var->dimen_count;
  if (iVar2 < 1) {
    lVar4 = 1;
  }
  else {
    lVar4 = 1;
    lVar3 = 0;
    do {
      sVar1 = (size_t)var->dimens[lVar3].static_size;
      if (sVar1 == 0) {
        iVar2 = var->dimens[lVar3].control_field_index;
        local_48.offset = (size_t)f->field_list[iVar2].field_offset;
        local_48.data_type = integer_type;
        local_48.size = f->field_list[iVar2].field_size;
        iVar2 = encode;
        if (encode != 0) {
          iVar2 = f->byte_reversal;
        }
        local_48._17_7_ = 0;
        local_48.byte_swap = (byte)iVar2;
        sVar1 = get_FMlong(&local_48,data);
        iVar2 = var->dimen_count;
      }
      lVar4 = lVar4 * sVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar2);
  }
  return lVar4;
}

Assistant:

extern long
FMget_array_element_count(FMFormat f, FMVarInfoList var, char *data, int encode)
{
    int i;
    size_t count = 1;
    size_t tmp;
    for (i = 0; i < var->dimen_count; i++) {
	if (var->dimens[i].static_size != 0) {
	    count = count * var->dimens[i].static_size;
	} else {
	    int field = var->dimens[i].control_field_index;
	    struct _FMgetFieldStruct tmp_src_spec;
	    memset(&tmp_src_spec, 0, sizeof(tmp_src_spec));
	    tmp_src_spec.size = f->field_list[field].field_size;
	    tmp_src_spec.offset = f->field_list[field].field_offset;
	    tmp_src_spec.data_type = integer_type;
	    tmp_src_spec.byte_swap = f->byte_reversal;
	    if (!encode) {
		tmp_src_spec.byte_swap = 0;
		tmp_src_spec.src_float_format = tmp_src_spec.target_float_format;
	    }
	    tmp = get_FMlong(&tmp_src_spec, data);
	    count = count * tmp;
	}
    }
    return (long) count;
}